

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.cpp
# Opt level: O2

void TestSignalInClass(void)

{
  __type actual;
  string dataB;
  TestA ta;
  connection local_90;
  connection local_78;
  TestB tb;
  
  TestRunner::StartTest("TestSignalInClass");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dataB,"DFBZ12Paql",(allocator<char> *)&ta);
  TestA::TestA(&ta);
  TestB::TestB(&tb);
  lsignal::signal<void(int)>::connect<TestB,TestB>(&local_78,&ta.sigA,&tb,0x112762,(slot *)0x0);
  lsignal::connection::~connection(&local_78);
  lsignal::signal<void(std::__cxx11::string_const&)>::connect<TestA,TestA>
            (&local_90,&tb.sigB,&ta,0x112800,(slot *)0x0);
  lsignal::connection::~connection(&local_90);
  lsignal::signal<void_(int)>::operator()(&ta.sigA,0x3ff);
  lsignal::
  signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()(&tb.sigB,&dataB);
  AssertHelper::VerifyValue(true,tb.dataA == 0x3ff,"Verify dataA");
  actual = std::operator==(&ta.dataB,&dataB);
  AssertHelper::VerifyValue(true,actual,"Verify dataB");
  TestB::~TestB(&tb);
  TestA::~TestA(&ta);
  std::__cxx11::string::~string((string *)&dataB);
  return;
}

Assistant:

void TestSignalInClass()
{
	TestRunner::StartTest(MethodName);

	int dataA = 1023;
	std::string dataB = "DFBZ12Paql";
	TestA ta;
	TestB tb;

	ta.sigA.connect(&tb, &TestB::ReceiveSigA, &tb);
	tb.sigB.connect(&ta, &TestA::ReceiveSigB, &ta);

	ta.sigA(dataA);
	tb.sigB(dataB);

	AssertHelper::VerifyValue(true, tb.dataA == dataA, "Verify dataA");
	AssertHelper::VerifyValue(true, ta.dataB == dataB, "Verify dataB");
}